

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::Result(XmlReporter *this,AssertionResult *assertionResult)

{
  uint uVar1;
  OfType OVar2;
  IConfig *pIVar3;
  XmlWriter *pXVar4;
  ScopedElement *pSVar5;
  bool bVar6;
  undefined1 local_3a0 [40];
  string local_378 [32];
  undefined1 local_358 [8];
  undefined1 local_350 [40];
  string local_328 [32];
  undefined1 local_308 [8];
  undefined1 local_300 [40];
  string local_2d8 [32];
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [80];
  string local_260 [32];
  SourceLineInfo local_240;
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [32];
  undefined1 local_1c8 [8];
  undefined1 local_1c0 [40];
  string local_198 [32];
  undefined1 local_178 [8];
  undefined1 local_170 [40];
  string local_148 [32];
  undefined1 local_128 [40];
  unsigned_long local_100;
  allocator local_f1;
  string local_f0 [32];
  SourceLineInfo local_d0;
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50 [48];
  ReporterConfig local_20;
  AssertionResult *assertionResult_local;
  XmlReporter *this_local;
  
  local_20.m_fullConfig.m_p = (IConfig *)assertionResult;
  assertionResult_local = (AssertionResult *)this;
  ReporterConfig::fullConfig(&local_20);
  pIVar3 = Ptr<Catch::IConfig>::operator->((Ptr<Catch::IConfig> *)&local_20);
  uVar1 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[7])();
  bVar6 = false;
  if ((uVar1 & 1) == 0) {
    OVar2 = AssertionResult::getResultType((AssertionResult *)local_20.m_fullConfig.m_p);
    bVar6 = OVar2 == Ok;
  }
  Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)&local_20);
  if (!bVar6) {
    bVar6 = AssertionResult::hasExpression((AssertionResult *)local_20.m_fullConfig.m_p);
    if (bVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,"Expression",&local_51);
      pXVar4 = XmlWriter::startElement(&this->m_xml,(string *)local_50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"success",&local_79);
      bVar6 = AssertionResult::succeeded((AssertionResult *)local_20.m_fullConfig.m_p);
      pXVar4 = XmlWriter::writeAttribute(pXVar4,(string *)local_78,bVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"filename",&local_a1);
      AssertionResult::getSourceInfo(&local_d0,(AssertionResult *)local_20.m_fullConfig.m_p);
      pXVar4 = XmlWriter::writeAttribute(pXVar4,(string *)local_a0,&local_d0.file);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"line",&local_f1);
      AssertionResult::getSourceInfo
                ((SourceLineInfo *)(local_128 + 8),(AssertionResult *)local_20.m_fullConfig.m_p);
      XmlWriter::writeAttribute<unsigned_long>(pXVar4,(string *)local_f0,&local_100);
      SourceLineInfo::~SourceLineInfo((SourceLineInfo *)(local_128 + 8));
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      SourceLineInfo::~SourceLineInfo(&local_d0);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"Original",(allocator *)(local_170 + 0x27));
      XmlWriter::scopedElement((XmlWriter *)local_128,(string *)&this->m_xml);
      AssertionResult::getExpression_abi_cxx11_((AssertionResult *)local_170);
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_128,(string *)local_170,true);
      std::__cxx11::string::~string((string *)local_170);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_128);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)(local_170 + 0x27));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_198,"Expanded",(allocator *)(local_1c0 + 0x27));
      XmlWriter::scopedElement((XmlWriter *)local_178,(string *)&this->m_xml);
      AssertionResult::getExpandedExpression_abi_cxx11_((AssertionResult *)local_1c0);
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_178,(string *)local_1c0,true);
      std::__cxx11::string::~string((string *)local_1c0);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_178);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator((allocator<char> *)(local_1c0 + 0x27));
      bVar6 = AssertionResult::succeeded((AssertionResult *)local_20.m_fullConfig.m_p);
      this->m_currentTestSuccess = (this->m_currentTestSuccess & 1U & bVar6) != 0;
    }
    OVar2 = AssertionResult::getResultType((AssertionResult *)local_20.m_fullConfig.m_p);
    if (1 < (uint)(OVar2 + Info)) {
      if (OVar2 == Info) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d8,"Info",(allocator *)(local_300 + 0x27));
        XmlWriter::scopedElement((XmlWriter *)local_2b8,(string *)&this->m_xml);
        AssertionResult::getMessage_abi_cxx11_((AssertionResult *)local_300);
        XmlWriter::ScopedElement::writeText((ScopedElement *)local_2b8,(string *)local_300,true);
        std::__cxx11::string::~string((string *)local_300);
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_2b8);
        std::__cxx11::string::~string(local_2d8);
        std::allocator<char>::~allocator((allocator<char> *)(local_300 + 0x27));
      }
      else if (OVar2 == Warning) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_328,"Warning",(allocator *)(local_350 + 0x27));
        XmlWriter::scopedElement((XmlWriter *)local_308,(string *)&this->m_xml);
        AssertionResult::getMessage_abi_cxx11_((AssertionResult *)local_350);
        XmlWriter::ScopedElement::writeText((ScopedElement *)local_308,(string *)local_350,true);
        std::__cxx11::string::~string((string *)local_350);
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_308);
        std::__cxx11::string::~string(local_328);
        std::allocator<char>::~allocator((allocator<char> *)(local_350 + 0x27));
      }
      else if (1 < (uint)(OVar2 + 0xfffffff0)) {
        if (OVar2 == ExplicitFailure) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_378,"Failure",(allocator *)(local_3a0 + 0x27));
          XmlWriter::scopedElement((XmlWriter *)local_358,(string *)&this->m_xml);
          AssertionResult::getMessage_abi_cxx11_((AssertionResult *)local_3a0);
          XmlWriter::ScopedElement::writeText((ScopedElement *)local_358,(string *)local_3a0,true);
          std::__cxx11::string::~string((string *)local_3a0);
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_358);
          std::__cxx11::string::~string(local_378);
          std::allocator<char>::~allocator((allocator<char> *)(local_3a0 + 0x27));
          this->m_currentTestSuccess = false;
        }
        else if ((OVar2 != Exception) && (OVar2 == ThrewException)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1e8,"Exception",&local_1e9);
          XmlWriter::scopedElement((XmlWriter *)local_1c8,(string *)&this->m_xml);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_210,"filename",&local_211);
          AssertionResult::getSourceInfo(&local_240,(AssertionResult *)local_20.m_fullConfig.m_p);
          pSVar5 = XmlWriter::ScopedElement::writeAttribute<std::__cxx11::string>
                             ((ScopedElement *)local_1c8,(string *)local_210,&local_240.file);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_260,"line",(allocator *)(local_2b0 + 0x4f));
          AssertionResult::getSourceInfo
                    ((SourceLineInfo *)(local_2b0 + 0x20),
                     (AssertionResult *)local_20.m_fullConfig.m_p);
          pSVar5 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                             (pSVar5,(string *)local_260,(unsigned_long *)(local_2b0 + 0x40));
          AssertionResult::getMessage_abi_cxx11_((AssertionResult *)local_2b0);
          XmlWriter::ScopedElement::writeText(pSVar5,(string *)local_2b0,true);
          std::__cxx11::string::~string((string *)local_2b0);
          SourceLineInfo::~SourceLineInfo((SourceLineInfo *)(local_2b0 + 0x20));
          std::__cxx11::string::~string(local_260);
          std::allocator<char>::~allocator((allocator<char> *)(local_2b0 + 0x4f));
          SourceLineInfo::~SourceLineInfo(&local_240);
          std::__cxx11::string::~string(local_210);
          std::allocator<char>::~allocator((allocator<char> *)&local_211);
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_1c8);
          std::__cxx11::string::~string(local_1e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
          this->m_currentTestSuccess = false;
        }
      }
    }
    bVar6 = AssertionResult::hasExpression((AssertionResult *)local_20.m_fullConfig.m_p);
    if (bVar6) {
      XmlWriter::endElement(&this->m_xml);
    }
  }
  return;
}

Assistant:

virtual void Result( const Catch::AssertionResult& assertionResult ) {
            if( !m_config.fullConfig()->includeSuccessfulResults() && assertionResult.getResultType() == ResultWas::Ok )
                return;

            if( assertionResult.hasExpression() ) {
                m_xml.startElement( "Expression" )
                    .writeAttribute( "success", assertionResult.succeeded() )
                    .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                    .writeAttribute( "line", assertionResult.getSourceInfo().line );

                m_xml.scopedElement( "Original" )
                    .writeText( assertionResult.getExpression() );
                m_xml.scopedElement( "Expanded" )
                    .writeText( assertionResult.getExpandedExpression() );
                m_currentTestSuccess &= assertionResult.succeeded();
            }

            switch( assertionResult.getResultType() ) {
                case ResultWas::ThrewException:
                    m_xml.scopedElement( "Exception" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    m_currentTestSuccess = false;
                    break;
                case ResultWas::Info:
                    m_xml.scopedElement( "Info" )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Warning:
                    m_xml.scopedElement( "Warning" )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::ExplicitFailure:
                    m_xml.scopedElement( "Failure" )
                        .writeText( assertionResult.getMessage() );
                    m_currentTestSuccess = false;
                    break;
                case ResultWas::Unknown:
                case ResultWas::Ok:
                case ResultWas::FailureBit:
                case ResultWas::ExpressionFailed:
                case ResultWas::Exception:
                case ResultWas::DidntThrowException:
                    break;
            }
            if( assertionResult.hasExpression() )
                m_xml.endElement();
        }